

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

DdNode * Llb_NonlinImage(Aig_Man_t *pAig,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vRoots,int *pVars2Q,
                        DdManager *dd,DdNode *bCurrent,int fReorder,int fVerbose,int *pOrder)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Llb_Mgr_t *p_00;
  abctime aVar5;
  DdNode *n;
  abctime clk2;
  abctime clk;
  int timeInside;
  int nReorders;
  int i;
  DdNode *bTemp;
  DdNode *bFunc;
  Llb_Mgr_t *p;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *pPart;
  DdNode *bCurrent_local;
  DdManager *dd_local;
  int *pVars2Q_local;
  Vec_Ptr_t *vRoots_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Man_t *pAig_local;
  
  pPart = (Llb_Prt_t *)bCurrent;
  bCurrent_local = &dd->sentinel;
  dd_local = (DdManager *)pVars2Q;
  pVars2Q_local = &vRoots->nCap;
  vRoots_local = vLeaves;
  vLeaves_local = (Vec_Ptr_t *)pAig;
  aVar3 = Abc_Clock();
  aVar4 = Abc_Clock();
  p_00 = Llb_NonlinAlloc((Aig_Man_t *)vLeaves_local,vRoots_local,(Vec_Ptr_t *)pVars2Q_local,
                         (int *)dd_local,(DdManager *)bCurrent_local);
  iVar1 = Llb_NonlinStart(p_00);
  if (iVar1 == 0) {
    Llb_NonlinFree(p_00);
    pAig_local = (Aig_Man_t *)0x0;
  }
  else {
    iVar1 = p_00->iPartFree;
    p_00->iPartFree = iVar1 + 1;
    Llb_NonlinAddPartition(p_00,iVar1,(DdNode *)pPart);
    for (timeInside = 0; timeInside < p_00->iPartFree; timeInside = timeInside + 1) {
      pPart1 = Llb_MgrPart(p_00,timeInside);
      if ((pPart1 != (Llb_Prt_t *)0x0) &&
         (iVar1 = Llb_NonlinHasSingletonVars(p_00,pPart1), iVar1 != 0)) {
        Llb_NonlinQuantify1(p_00,pPart1,0);
      }
    }
    aVar5 = Abc_Clock();
    timeBuild = (aVar5 - aVar4) + timeBuild;
    aVar5 = Abc_Clock();
    clk._4_4_ = (int)aVar5 - (int)aVar4;
    Llb_NonlinRecomputeScores(p_00);
    if (pOrder != (int *)0x0) {
      memcpy(pOrder,bCurrent_local[8].next,(long)*(int *)&bCurrent_local[3].type << 2);
    }
    while (iVar1 = Llb_NonlinNextPartitions(p_00,&pPart2,(Llb_Prt_t **)&p), iVar1 != 0) {
      aVar4 = Abc_Clock();
      iVar1 = Cudd_ReadReorderings((DdManager *)bCurrent_local);
      iVar2 = Llb_NonlinQuantify2(p_00,pPart2,(Llb_Prt_t *)p);
      if (iVar2 == 0) {
        Llb_NonlinFree(p_00);
        return (DdNode *)0x0;
      }
      aVar5 = Abc_Clock();
      timeAndEx = (aVar5 - aVar4) + timeAndEx;
      aVar5 = Abc_Clock();
      clk._4_4_ = clk._4_4_ + ((int)aVar5 - (int)aVar4);
      iVar2 = Cudd_ReadReorderings((DdManager *)bCurrent_local);
      if (iVar1 < iVar2) {
        Llb_NonlinRecomputeScores(p_00);
      }
    }
    bTemp = Cudd_ReadOne(p_00->dd);
    Cudd_Ref(bTemp);
    for (timeInside = 0; timeInside < p_00->iPartFree; timeInside = timeInside + 1) {
      pPart1 = Llb_MgrPart(p_00,timeInside);
      if (pPart1 != (Llb_Prt_t *)0x0) {
        n = Cudd_bddAnd(p_00->dd,bTemp,pPart1->bFunc);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p_00->dd,bTemp);
        bTemp = n;
      }
    }
    nSuppMax = p_00->nSuppMax;
    Llb_NonlinFree(p_00);
    if (fReorder != 0) {
      Llb_NonlinReorder((DdManager *)bCurrent_local,0,fVerbose);
    }
    aVar4 = Abc_Clock();
    timeOther = ((aVar4 - aVar3) - (long)clk._4_4_) + timeOther;
    Cudd_Deref(bTemp);
    pAig_local = (Aig_Man_t *)bTemp;
  }
  return (DdNode *)pAig_local;
}

Assistant:

DdNode * Llb_NonlinImage( Aig_Man_t * pAig, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, int * pVars2Q, 
    DdManager * dd, DdNode * bCurrent, int fReorder, int fVerbose, int * pOrder )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders, timeInside;
    abctime clk = Abc_Clock(), clk2;
    // start the manager
    clk2 = Abc_Clock();
    p = Llb_NonlinAlloc( pAig, vLeaves, vRoots, pVars2Q, dd );
    if ( !Llb_NonlinStart( p ) )
    {
        Llb_NonlinFree( p );
        return NULL;
    }
    // add partition
    Llb_NonlinAddPartition( p, p->iPartFree++, bCurrent );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_NonlinHasSingletonVars(p, pPart) )
            Llb_NonlinQuantify1( p, pPart, 0 );
    timeBuild += Abc_Clock() - clk2;
    timeInside = Abc_Clock() - clk2;
    // compute scores
    Llb_NonlinRecomputeScores( p );
    // save permutation
    if ( pOrder )
    memcpy( pOrder, dd->invperm, sizeof(int) * dd->size );
    // iteratively quantify variables
    while ( Llb_NonlinNextPartitions(p, &pPart1, &pPart2) )
    {
        clk2 = Abc_Clock();
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_NonlinQuantify2( p, pPart1, pPart2 ) )
        {
            Llb_NonlinFree( p );
            return NULL;
        }
        timeAndEx  += Abc_Clock() - clk2;
        timeInside += Abc_Clock() - clk2;
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_NonlinRecomputeScores( p );
//        else
//            Llb_NonlinVerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    nSuppMax = p->nSuppMax;
    Llb_NonlinFree( p );
    // reorder variables
    if ( fReorder )
        Llb_NonlinReorder( dd, 0, fVerbose );
    timeOther += Abc_Clock() - clk - timeInside;
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}